

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall GlobOpt::OptTagChecks(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  StackSym *sym;
  Sym *this_00;
  Type pJVar2;
  BVSparse<Memory::JitArenaAllocator> *pBVar3;
  code *pcVar4;
  bool bVar5;
  ValueType VVar6;
  uint sourceContextId;
  uint functionId;
  SymOpnd *pSVar7;
  PropertySym *pPVar8;
  StackSym **ppSVar9;
  StackSym *pSVar10;
  ValueInfo *pVVar11;
  undefined6 extraout_var;
  BailOutInstrTemplate<IR::Instr> *instr_00;
  RegOpnd *pRVar12;
  BVSparse<Memory::JitArenaAllocator> *instrByteCodeStackSymUsed;
  Value *value;
  Opnd *this_01;
  PropertySym *local_68;
  PropertySym *tempPropertySymUse;
  RegOpnd *local_58;
  SymOpnd *local_50;
  BVSparse<Memory::JitArenaAllocator> *local_48;
  Value *local_40;
  undefined4 local_38;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar5 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,OptTagChecksPhase,sourceContextId,functionId);
  if (bVar5) {
    return false;
  }
  if ((this->field_0xf7 & 4) == 0) {
    return false;
  }
  OVar1 = instr->m_opcode;
  if ((OVar1 == LdFld) || (OVar1 == LdMethodFld)) {
LAB_00427be4:
    this_01 = instr->m_src1;
  }
  else {
    if (OVar1 != StFld) {
      if ((OVar1 == BailOnNotObject) || (OVar1 == BailOnNotArray)) {
        bVar5 = IR::Opnd::IsRegOpnd(instr->m_src1);
        if (!bVar5) {
          return false;
        }
        pRVar12 = IR::Opnd::AsRegOpnd(instr->m_src1);
        ppSVar9 = &pRVar12->m_sym;
        pSVar7 = (SymOpnd *)0x0;
        goto LAB_00427c00;
      }
      if ((OVar1 != CheckPropertyGuardAndLoadType) && (OVar1 != CheckFixedFld)) {
        return false;
      }
      goto LAB_00427be4;
    }
    this_01 = instr->m_dst;
  }
  pSVar7 = IR::Opnd::AsSymOpnd(this_01);
  pPVar8 = Sym::AsPropertySym(pSVar7->m_sym);
  ppSVar9 = &pPVar8->m_stackSym;
  pRVar12 = (RegOpnd *)0x0;
LAB_00427c00:
  sym = *ppSVar9;
  if ((sym != (StackSym *)0x0) &&
     (local_40 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&sym->super_Sym),
     local_40 != (Value *)0x0)) {
    pVVar11 = local_40->valueInfo;
    this_00 = pVVar11->symStore;
    if ((this_00 != (Sym *)0x0) && (this_00->m_kind == SymKindStack)) {
      pSVar10 = Sym::AsStackSym(this_00);
      if ((pSVar10->field_0x1a & 4) != 0) {
        return false;
      }
      pVVar11 = local_40->valueInfo;
    }
    local_32[0] = (pVVar11->super_ValueType).field_0;
    OVar1 = instr->m_opcode;
    local_58 = pRVar12;
    local_50 = pSVar7;
    bVar5 = ValueType::CanBeTaggedValue((ValueType *)&local_32[0].field_0);
    if (OVar1 == BailOnNotObject) {
      if (bVar5) {
        VVar6 = ValueType::SetCanBeTaggedValue((ValueType *)&local_32[0].field_0,false);
        ChangeValueType(this,(BasicBlock *)0x0,local_40,VVar6,true,false);
      }
      else if (this->prePassLoop == (Loop *)0x0) {
        if (this->byteCodeUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          InsertByteCodeUses(this,instr,false);
        }
        BasicBlock::RemoveInstr(this->currentBlock,instr);
      }
      return !bVar5;
    }
    if (((bVar5) && (bVar5 = ValueType::HasBeenNumber((ValueType *)&local_32[0].field_0), !bVar5))
       && (this->prePassLoop == (Loop *)0x0)) {
      VVar6 = ValueType::SetCanBeTaggedValue((ValueType *)&local_32[0].field_0,false);
      local_38 = (undefined4)CONCAT62(extraout_var,VVar6.field_0);
      instr_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                           (BailOnNotObject,BailOutOnTaggedValue,instr,instr->m_func);
      if (this->prePassLoop == (Loop *)0x0) {
        FillBailOutInfo(this,this->currentBlock,&instr_00->super_Instr);
      }
      pRVar12 = local_58;
      if (local_58 == (RegOpnd *)0x0) {
        pRVar12 = IR::RegOpnd::New(sym,sym->m_type,instr->m_func);
        if (local_50 == (SymOpnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          local_48 = (BVSparse<Memory::JitArenaAllocator> *)__tls_get_addr(&PTR_013e5f18);
          *(undefined4 *)&local_48->head = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xb84,"(symOpnd)","symOpnd");
          if (!bVar5) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *(undefined4 *)&local_48->head = 0;
        }
        if (((local_50->super_Opnd).field_0xb & 8) != 0) {
          IR::Opnd::SetIsJITOptimizedReg(&pRVar12->super_Opnd,true);
        }
      }
      IR::Instr::SetSrc1(&instr_00->super_Instr,&pRVar12->super_Opnd);
      IR::Opnd::SetValueType((instr_00->super_Instr).m_src1,(ValueType)local_32[0].field_0);
      IR::Instr::SetByteCodeOffset(&instr_00->super_Instr,instr);
      IR::Instr::InsertBefore(instr,&instr_00->super_Instr);
      if (this->currentBlock->loop != (Loop *)0x0) {
        local_48 = this->byteCodeUses;
        tempPropertySymUse = this->propertySymUse;
        local_68 = (PropertySym *)0x0;
        this->byteCodeUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        instrByteCodeStackSymUsed =
             (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,this->tempAlloc,0x3d6ef4);
        pJVar2 = this->tempAlloc;
        instrByteCodeStackSymUsed->head = (Type_conflict)0x0;
        instrByteCodeStackSymUsed->lastFoundIndex = (Type_conflict)0x0;
        instrByteCodeStackSymUsed->alloc = pJVar2;
        instrByteCodeStackSymUsed->lastUsedNodePrevNextField = (Type)instrByteCodeStackSymUsed;
        pBVar3 = this->byteCodeUsesBeforeOpt;
        this->byteCodeUsesBeforeOpt = instrByteCodeStackSymUsed;
        this->propertySymUse = (PropertySym *)0x0;
        TrackByteCodeSymUsed(&instr_00->super_Instr,instrByteCodeStackSymUsed,&local_68);
        bVar5 = TryHoistInvariant(this,&instr_00->super_Instr,this->currentBlock,(Value *)0x0,
                                  local_40,(Value *)0x0,true,false,false,BailOutOnTaggedValue);
        if (bVar5) {
          value = GlobOptBlockData::FindValue
                            (&this->currentBlock->loop->landingPad->globOptData,&sym->super_Sym);
          VVar6 = ValueType::SetCanBeTaggedValue(&value->valueInfo->super_ValueType,false);
          ChangeValueType(this,(BasicBlock *)0x0,value,VVar6,false,false);
        }
        this->byteCodeUses = local_48;
        this->propertySymUse = tempPropertySymUse;
        this->byteCodeUsesBeforeOpt = pBVar3;
      }
      VVar6.field_0 = SUB42(local_38,0);
      if (local_50 == (SymOpnd *)0x0) {
        IR::Opnd::SetValueType(&local_58->super_Opnd,VVar6);
      }
      else {
        (local_50->propertyOwnerValueType).field_0.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar6.field_0;
      }
      ChangeValueType(this,(BasicBlock *)0x0,local_40,VVar6,false,false);
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::OptTagChecks(IR::Instr *instr)
{
    if (PHASE_OFF(Js::OptTagChecksPhase, this->func) || !this->DoTagChecks())
    {
        return false;
    }

    StackSym *stackSym = nullptr;
    IR::SymOpnd *symOpnd = nullptr;
    IR::RegOpnd *regOpnd = nullptr;

    switch(instr->m_opcode)
    {
    case Js::OpCode::LdFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::CheckFixedFld:
    case Js::OpCode::CheckPropertyGuardAndLoadType:
        symOpnd = instr->GetSrc1()->AsSymOpnd();
        stackSym = symOpnd->m_sym->AsPropertySym()->m_stackSym;
        break;

    case Js::OpCode::BailOnNotObject:
    case Js::OpCode::BailOnNotArray:
        if (instr->GetSrc1()->IsRegOpnd())
        {
            regOpnd = instr->GetSrc1()->AsRegOpnd();
            stackSym = regOpnd->m_sym;
        }
        break;

    case Js::OpCode::StFld:
        symOpnd = instr->GetDst()->AsSymOpnd();
        stackSym = symOpnd->m_sym->AsPropertySym()->m_stackSym;
        break;
    }

    if (stackSym)
    {
        Value *value = CurrentBlockData()->FindValue(stackSym);
        if (value)
        {
            ValueInfo *valInfo = value->GetValueInfo();
            if (valInfo->GetSymStore() && valInfo->GetSymStore()->IsStackSym() && valInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable())
            {
                return false;
            }
            ValueType valueType = value->GetValueInfo()->Type();
            if (instr->m_opcode == Js::OpCode::BailOnNotObject)
            {
                if (valueType.CanBeTaggedValue())
                {
                    // We're not adding new information to the value other than changing the value type. Preserve any existing
                    // information and just change the value type.
                    ChangeValueType(nullptr, value, valueType.SetCanBeTaggedValue(false), true /*preserveSubClassInfo*/);
                    return false;
                }
                if (!this->IsLoopPrePass())
                {
                    if (this->byteCodeUses)
                    {
                        this->InsertByteCodeUses(instr);
                    }
                    this->currentBlock->RemoveInstr(instr);
                }
                return true;
            }

            if (valueType.CanBeTaggedValue() &&
                !valueType.HasBeenNumber() &&
                !this->IsLoopPrePass())
            {
                ValueType newValueType = valueType.SetCanBeTaggedValue(false);

                // Split out the tag check as a separate instruction.
                IR::Instr *bailOutInstr;
                bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotObject, IR::BailOutOnTaggedValue, instr, instr->m_func);
                if (!this->IsLoopPrePass())
                {
                    FillBailOutInfo(this->currentBlock, bailOutInstr);
                }
                IR::RegOpnd *srcOpnd = regOpnd;
                if (!srcOpnd)
                {
                    srcOpnd = IR::RegOpnd::New(stackSym, stackSym->GetType(), instr->m_func);
                    AnalysisAssert(symOpnd);
                    if (symOpnd->GetIsJITOptimizedReg())
                    {
                        srcOpnd->SetIsJITOptimizedReg(true);
                    }
                }
                bailOutInstr->SetSrc1(srcOpnd);
                bailOutInstr->GetSrc1()->SetValueType(valueType);
                bailOutInstr->SetByteCodeOffset(instr);
                instr->InsertBefore(bailOutInstr);
                if (this->currentBlock->loop)
                {
                    // Try hoisting the BailOnNotObject instr.
                    // But since this isn't the current instr being optimized, we need to play tricks with
                    // the byteCodeUse fields...
                    TrackByteCodeUsesForInstrAddedInOptInstr(bailOutInstr, [&]()
                    {
                        if (TryHoistInvariant(bailOutInstr, this->currentBlock, nullptr, value, nullptr, true, false, false, IR::BailOutOnTaggedValue))
                        {
                            Value* landingPadValue = this->currentBlock->loop->landingPad->globOptData.FindValue(stackSym);
                            ValueType newLandingPadValueType = landingPadValue->GetValueInfo()->Type().SetCanBeTaggedValue(false);
                            ChangeValueType(nullptr, landingPadValue, newLandingPadValueType, false);
                        }
                    });
                }
                if (symOpnd)
                {
                    symOpnd->SetPropertyOwnerValueType(newValueType);
                }
                else
                {
                    regOpnd->SetValueType(newValueType);
                }
                ChangeValueType(nullptr, value, newValueType, false);
            }
        }
    }

    return false;
}